

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::MaterialNode> __thiscall
embree::XMLLoader::loadBGFMaterial(XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *pXVar1;
  Ref<embree::XML> *in_RDX;
  Parms parms;
  string name;
  string type;
  allocator local_91;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>_>
  local_90;
  string local_60;
  string local_40;
  
  pXVar1 = in_RDX->ptr;
  std::__cxx11::string::string((string *)&local_90,"type",(allocator *)&local_60);
  XML::parm(&local_40,pXVar1,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  pXVar1 = in_RDX->ptr;
  std::__cxx11::string::string((string *)&local_90,"name",&local_91);
  XML::parm(&local_60,pXVar1,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  loadMaterialParms((Parms *)&local_90,(XMLLoader *)xml,in_RDX);
  addMaterial(this,(string *)xml,(Parms *)&local_40);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>_>
  ::~_Rb_tree(&local_90);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return (Ref<embree::SceneGraph::MaterialNode>)(MaterialNode *)this;
}

Assistant:

Ref<SceneGraph::MaterialNode> XMLLoader::loadBGFMaterial(const Ref<XML>& xml) 
  {
    std::string type = xml->parm("type");
    std::string name = xml->parm("name");
    Parms parms = loadMaterialParms(xml);
    return addMaterial(type,parms);
  }